

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O0

bool Game::addTileOnGameboard(GameBoard *gb)

{
  bool bVar1;
  GameBoard *gb_local;
  
  bVar1 = anon_unknown_0::addTileOnGameboardDataArray(&gb->gbda);
  return bVar1;
}

Assistant:

bool addTileOnGameboard(GameBoard &gb) {
  return addTileOnGameboardDataArray(gb.gbda);
}